

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O3

int __thiscall ComplexType::fromBuffer(ComplexType *this,uint8_t *buf,size_t max_len)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  byte *pbVar6;
  shared_ptr<BER_CONTAINER> newObj;
  _func_int **local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  uVar3 = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < (int)uVar3) {
    pbVar6 = buf + uVar3;
    uVar5 = 1;
    do {
      iVar1 = (this->super_BER_CONTAINER)._length;
      if ((max_len < uVar5) || ((ulong)(long)iVar1 <= uVar5)) {
        return iVar1 + 2;
      }
      createObjectForType((ComplexType *)&local_50,(uint)*pbVar6);
      if (local_50 == (_func_int **)0x0) {
        uVar3 = 0xfffffff2;
LAB_0010596d:
        bVar2 = false;
      }
      else {
        uVar4 = (**(code **)(*local_50 + 0x20))(local_50,pbVar6,max_len - uVar5);
        if ((int)uVar4 < 0) {
          uVar3 = 0xfffffff3;
          goto LAB_0010596d;
        }
        addValueToList((ComplexType *)&stack0xffffffffffffffc0,(shared_ptr<BER_CONTAINER> *)this);
        if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
        }
        pbVar6 = pbVar6 + uVar4;
        uVar5 = uVar5 + uVar4;
        bVar2 = true;
      }
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
    } while (bVar2);
  }
  return uVar3;
}

Assistant:

int ComplexType::fromBuffer(const uint8_t *buf, size_t max_len){
    int j = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(j);
    const uint8_t* ptr = buf + j;

    size_t i = 1;
    while(i < (size_t)_length && i <= max_len){
        ASN_TYPE valueType = (ASN_TYPE)*ptr;

        auto newObj = ComplexType::createObjectForType(valueType);
        if(!newObj){
            SNMP_LOGD("Couldn't create object of type: %d\n", valueType);
            return SNMP_BUFFER_ERROR_UNKNOWN_TYPE;
        }

        int used_length = newObj->fromBuffer(ptr, max_len - i);
        if(used_length < 0){
            // Problem de-serialising
            SNMP_LOGD("Problem deserialising structure of type: %d\n", valueType);
            return SNMP_BUFFER_ERROR_PROBLEM_DESERIALISING;
        }

        addValueToList(newObj);

        ptr += used_length; 
        i += used_length;
    }
    return _length + 2;
}